

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storage.hpp
# Opt level: O0

void __thiscall
benchmarks::StorageArray<std::recursive_mutex>::StorageArray
          (StorageArray<std::recursive_mutex> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  Storage<std::recursive_mutex> *pSVar4;
  ulong uVar5;
  Storage<std::recursive_mutex> *local_50;
  int64_t size_local;
  StorageArray<std::recursive_mutex> *this_local;
  
  this->_size = size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar5 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar3 = (int64_t *)operator_new__(uVar5);
  *piVar3 = size;
  pSVar4 = (Storage<std::recursive_mutex> *)(piVar3 + 1);
  if (size != 0) {
    local_50 = pSVar4;
    do {
      Storage<std::recursive_mutex>::Storage((Storage<std::recursive_mutex> *)&local_50->_obj);
      local_50 = local_50 + 1;
    } while (local_50 != pSVar4 + size);
  }
  this->_arr = pSVar4;
  return;
}

Assistant:

StorageArray(int64_t size)
			: _size(size)
		{ _arr = new Storage<T_>[size]; }